

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O0

void __thiscall
afsm::
state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>::
defer_event<afsm::test::events::string_literal>
          (state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
           *this,string_literal *event)

{
  value_type local_40;
  id_type *local_38;
  anon_class_16_2_20c42392 local_30;
  string_literal *psStack_18;
  string_literal evt;
  string_literal *event_local;
  state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
  *this_local;
  
  psStack_18 = event;
  detail::null_observer::
  defer_event<afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,afsm::test::events::string_literal>
            ((null_observer *)this,this,event);
  local_38 = (id_type *)&detail::event<afsm::test::events::string_literal>::id;
  local_30.this = this;
  std::__cxx11::
  list<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
  ::
  emplace_back<afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>::defer_event<afsm::test::events::string_literal>(afsm::test::events::string_literal&&)::_lambda()_1_,afsm::detail::event_base::id_type_const*>
            ((list<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
              *)&this->deferred_events_,&local_30,&local_38);
  local_40 = (value_type)&detail::event<afsm::test::events::string_literal>::id;
  std::
  set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::insert(&this->deferred_event_ids_,&local_40);
  return;
}

Assistant:

void
    defer_event(Event&& event)
    {
        using evt_identity = typename detail::event_identity<Event>::type;

        observer_wrapper::defer_event(*this, ::std::forward<Event>(event));
        Event evt{::std::forward<Event>(event)};
        deferred_events_.emplace_back([&, evt]() mutable {
            return process_event_dispatch(::std::move(evt));
        }, &evt_identity::id);
        deferred_event_ids_.insert(&evt_identity::id);
    }